

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O3

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<std::__cxx11::string*>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **v)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  pointer pbVar4;
  
  pbVar4 = (sv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (idx < (ulong)((long)(sv->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)) {
    lVar3 = idx << 5;
    bVar2 = false;
    do {
      iVar1 = ::std::__cxx11::string::compare((char *)((long)&(pbVar4->_M_dataplus)._M_p + lVar3));
      if (iVar1 == 0) {
        if (bVar2) {
          pbVar4 = (sv->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ss,*(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar3),
                     *(long *)((long)&pbVar4->_M_string_length + lVar3));
        }
        else {
          ::std::ostream::_M_insert<void_const*>(ss);
        }
        bVar2 = true;
      }
      else {
        pbVar4 = (sv->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ss,*(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar3),
                   *(long *)((long)&pbVar4->_M_string_length + lVar3));
      }
      idx = idx + 1;
      pbVar4 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (idx < (ulong)((long)(sv->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5));
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v) {
  if (idx >= sv.size()) {
    return ss;
  }

  // Print remaininig items
  bool fmt_printed{false};

  for (size_t i = idx; i < sv.size(); i++) {
    if (sv[i] == "{}") {
      if (fmt_printed) {
        ss << sv[i];
      } else {
        ss << v;
        fmt_printed = true;
      }
    } else {
      ss << sv[i];
    }
  }

  return ss;
}